

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O1

void __thiscall HEkkDual::updateFtranDSE(HEkkDual *this,HVector *DSE_Vector)

{
  if (this->rebuild_reason != 0) {
    return;
  }
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x43,0);
  if (this->analysis->analyse_simplex_summary_data == true) {
    HighsSimplexAnalysis::operationRecordBefore
              (this->analysis,8,DSE_Vector,(this->ekk_instance_->info_).row_DSE_density);
  }
  HSimplexNla::unapplyBasisMatrixRowScale(this->simplex_nla,DSE_Vector);
  HSimplexNla::ftranInScaledSpace
            (this->simplex_nla,DSE_Vector,(this->ekk_instance_->info_).row_DSE_density,
             this->analysis->pointer_serial_factor_clocks);
  if (this->analysis->analyse_simplex_summary_data == true) {
    HighsSimplexAnalysis::operationRecordAfter(this->analysis,8,DSE_Vector);
  }
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x43,0);
  HEkk::updateOperationResultDensity
            (this->ekk_instance_,(double)DSE_Vector->count * this->inv_solver_num_row,
             &(this->ekk_instance_->info_).row_DSE_density);
  return;
}

Assistant:

void HEkkDual::updateFtranDSE(HVector* DSE_Vector) {
  // Compute the vector required to update DSE weights - being FTRAN
  // applied to row_ep (FTRAN-DSE)
  //
  // When solving the unscaled LP with scaled NLA, have computed
  //
  // row_ep = R\bar{B}^{-T}C_B.e_p = cb.R\bar{B}^{-T}e_p
  //
  // to get row_ep in the unscaled space.
  //
  // To update DSE weights requires \bar{B}^{-1}\bar{B}^{-T}e_p, being
  //
  // (1/cp).\bar{B}^{-1}R^{-1}(cb.R\bar{B}^{-T}e_p)
  //
  // where cb.R\bar{B}^{-T}e_p is row_ep in the unscaled space.
  //
  // Operation R^{-1} is performed here. Operation (1/cp) is performed
  // when updating weights
  //
  // If reinversion is needed then skip this method
  if (rebuild_reason) return;
  analysis->simplexTimerStart(FtranDseClock);
  if (analysis->analyse_simplex_summary_data)
    analysis->operationRecordBefore(kSimplexNlaFtranDse, *DSE_Vector,
                                    ekk_instance_.info_.row_DSE_density);
  // Apply R{-1}
  simplex_nla->unapplyBasisMatrixRowScale(*DSE_Vector);

  // Perform FTRAN DSE
  simplex_nla->ftranInScaledSpace(*DSE_Vector,
                                  ekk_instance_.info_.row_DSE_density,
                                  analysis->pointer_serial_factor_clocks);
  if (analysis->analyse_simplex_summary_data)
    analysis->operationRecordAfter(kSimplexNlaFtranDse, *DSE_Vector);
  analysis->simplexTimerStop(FtranDseClock);
  const double local_row_DSE_density =
      (double)DSE_Vector->count * inv_solver_num_row;
  ekk_instance_.updateOperationResultDensity(
      local_row_DSE_density, ekk_instance_.info_.row_DSE_density);
}